

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkFromSopsInt(Abc_Ntk_t *pNtk,int nCubeLim,int nBTLimit,int nCostMax,int fCanon,int fReverse,
                  int fCnfShared,int fVerbose)

{
  Mem_Flex_t *pMVar1;
  Abc_Obj_t *pAVar2;
  Vec_Wec_t *p;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_00;
  char *pcVar7;
  char *__s2;
  Abc_Obj_t *pAVar8;
  word Cost;
  int nNodeMax;
  int nSuppMax;
  int iObjMax;
  int iCoMax;
  int iCi;
  int k;
  int i;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vSops;
  Vec_Int_t *vSupp;
  Vec_Wec_t *vSupps;
  Gia_Man_t *pGia;
  Abc_Ntk_t *pNtkNew;
  int local_30;
  int fReverse_local;
  int fCanon_local;
  int nCostMax_local;
  int nBTLimit_local;
  int nCubeLim_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtkNew._4_4_ = fReverse;
  local_30 = fCanon;
  fReverse_local = nCostMax;
  fCanon_local = nBTLimit;
  nCostMax_local = nCubeLim;
  _nBTLimit_local = pNtk;
  vSupps = (Vec_Wec_t *)Abc_NtkClpGia(pNtk);
  vSupp = (Vec_Int_t *)Gia_ManCreateCoSupps((Gia_Man_t *)vSupps,fVerbose);
  if ((0 < nCostMax_local) && (0 < fReverse_local)) {
    nSuppMax = Gia_ManCoLargestSupp((Gia_Man_t *)vSupps,(Vec_Wec_t *)vSupp);
    p = vSupps;
    pObj = Gia_ManCo((Gia_Man_t *)vSupps,nSuppMax);
    nNodeMax = Gia_ObjId((Gia_Man_t *)p,pObj);
    p_00 = Vec_WecEntry((Vec_Wec_t *)vSupp,nSuppMax);
    uVar3 = Vec_IntSize(p_00);
    uVar4 = Gia_ManConeSize((Gia_Man_t *)vSupps,&nNodeMax,1);
    if ((ulong)(long)fReverse_local <
        (ulong)((long)(int)uVar4 * (long)(int)uVar3 * (long)nCostMax_local)) {
      printf("Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n",
             (ulong)uVar4,(ulong)uVar3,(ulong)(uint)nCostMax_local,(ulong)(uint)fReverse_local);
      Gia_ManStop((Gia_Man_t *)vSupps);
      Vec_WecFree((Vec_Wec_t *)vSupp);
      return (Abc_Ntk_t *)0x0;
    }
  }
  pGia = (Gia_Man_t *)Abc_NtkStartFrom(_nBTLimit_local,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pNode = (Abc_Obj_t *)
          Abc_GiaDeriveSops((Abc_Ntk_t *)pGia,(Gia_Man_t *)vSupps,(Vec_Wec_t *)vSupp,nCostMax_local,
                            fCanon_local,fReverse_local,local_30,pNtkNew._4_4_,fCnfShared,fVerbose);
  Gia_ManStop((Gia_Man_t *)vSupps);
  if (pNode == (Abc_Obj_t *)0x0) {
    Vec_WecFree((Vec_Wec_t *)vSupp);
    Abc_NtkDelete((Abc_Ntk_t *)pGia);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    for (iCi = 0; iVar6 = iCi, iVar5 = Abc_NtkCoNum(_nBTLimit_local), iVar6 < iVar5; iCi = iCi + 1)
    {
      pNodeNew = Abc_NtkCo(_nBTLimit_local,iCi);
      _k = Abc_ObjFanin0(pNodeNew);
      iVar6 = Abc_ObjIsCi(_k);
      if (iVar6 == 0) {
LAB_002de9f7:
        iVar6 = Abc_ObjIsCi(_k);
        pAVar2 = _k;
        if (iVar6 == 0) {
          pAVar8 = Abc_AigConst1(_nBTLimit_local);
          if (pAVar2 == pAVar8) {
            pDriver = Abc_NtkCreateNode((Abc_Ntk_t *)pGia);
            pMVar1 = (Mem_Flex_t *)pGia->vFanout;
            iVar6 = Abc_ObjFaninC0(pNodeNew);
            pcVar7 = " 1\n";
            if (iVar6 != 0) {
              pcVar7 = " 0\n";
            }
            pcVar7 = Abc_SopRegister(pMVar1,pcVar7);
            (pDriver->field_5).pData = pcVar7;
            Abc_ObjAddFanin((pNodeNew->field_6).pCopy,pDriver);
          }
          else {
            pDriver = Abc_NtkCreateNode((Abc_Ntk_t *)pGia);
            vSops = (Vec_Ptr_t *)Vec_WecEntry((Vec_Wec_t *)vSupp,iCi);
            for (iCoMax = 0; iVar6 = iCoMax, iVar5 = Vec_IntSize((Vec_Int_t *)vSops), iVar6 < iVar5;
                iCoMax = iCoMax + 1) {
              iObjMax = Vec_IntEntry((Vec_Int_t *)vSops,iCoMax);
              pAVar2 = pDriver;
              pAVar8 = Abc_NtkCi((Abc_Ntk_t *)pGia,iObjMax);
              Abc_ObjAddFanin(pAVar2,pAVar8);
            }
            pMVar1 = (Mem_Flex_t *)pGia->vFanout;
            pcVar7 = (char *)Vec_PtrEntry((Vec_Ptr_t *)pNode,iCi);
            pcVar7 = Abc_SopRegister(pMVar1,pcVar7);
            (pDriver->field_5).pData = pcVar7;
            if ((pDriver->field_5).pData == (void *)0x1) {
              __assert_fail("pNodeNew->pData != (void *)(ABC_PTRINT_T)1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                            ,0x3a7,
                            "Abc_Ntk_t *Abc_NtkFromSopsInt(Abc_Ntk_t *, int, int, int, int, int, int, int)"
                           );
            }
            Abc_ObjAddFanin((pNodeNew->field_6).pCopy,pDriver);
          }
        }
        else {
          pDriver = Abc_NtkCreateNode((Abc_Ntk_t *)pGia);
          Abc_ObjAddFanin(pDriver,(_k->field_6).pCopy);
          pMVar1 = (Mem_Flex_t *)pGia->vFanout;
          iVar6 = Abc_ObjFaninC0(pNodeNew);
          pcVar7 = "1 1\n";
          if (iVar6 != 0) {
            pcVar7 = "0 1\n";
          }
          pcVar7 = Abc_SopRegister(pMVar1,pcVar7);
          (pDriver->field_5).pData = pcVar7;
          Abc_ObjAddFanin((pNodeNew->field_6).pCopy,pDriver);
        }
      }
      else {
        pcVar7 = Abc_ObjName(pNodeNew);
        __s2 = Abc_ObjName(_k);
        iVar6 = strcmp(pcVar7,__s2);
        if (iVar6 != 0) goto LAB_002de9f7;
        Abc_ObjAddFanin((pNodeNew->field_6).pCopy,(_k->field_6).pCopy);
      }
    }
    Vec_WecFree((Vec_Wec_t *)vSupp);
    Vec_PtrFree((Vec_Ptr_t *)pNode);
    Abc_NtkSortSops((Abc_Ntk_t *)pGia);
    pNtk_local = (Abc_Ntk_t *)pGia;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromSopsInt( Abc_Ntk_t * pNtk, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Gia_Man_t * pGia;
    Vec_Wec_t * vSupps;
    Vec_Int_t * vSupp;
    Vec_Ptr_t * vSops;
    Abc_Obj_t * pNode, * pNodeNew, * pDriver;
    int i, k, iCi; 
    pGia    = Abc_NtkClpGia( pNtk );
    vSupps  = Gia_ManCreateCoSupps( pGia, fVerbose );
    // check the largest output
    if ( nCubeLim > 0 && nCostMax > 0 )
    {
        int iCoMax   = Gia_ManCoLargestSupp( pGia, vSupps );
        int iObjMax  = Gia_ObjId( pGia, Gia_ManCo(pGia, iCoMax) );
        int nSuppMax = Vec_IntSize( Vec_WecEntry(vSupps, iCoMax) );
        int nNodeMax = Gia_ManConeSize( pGia, &iObjMax, 1 );
        word Cost = (word)nNodeMax * (word)nSuppMax * (word)nCubeLim;
        if ( Cost > (word)nCostMax )
        {
            printf( "Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n", 
                nNodeMax, nSuppMax, nCubeLim, nCostMax );
            Gia_ManStop( pGia );
            Vec_WecFree( vSupps );
            return NULL;
        }
    }
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    vSops   = Abc_GiaDeriveSops( pNtkNew, pGia, vSupps, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
    Gia_ManStop( pGia );
    if ( vSops == NULL )
    {
        Vec_WecFree( vSupps );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && !strcmp(Abc_ObjName(pNode), Abc_ObjName(pDriver)) )
        {
            Abc_ObjAddFanin( pNode->pCopy, pDriver->pCopy );
            continue;
        }
        if ( Abc_ObjIsCi(pDriver) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            Abc_ObjAddFanin( pNodeNew, pDriver->pCopy ); 
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? "0 1\n" : "1 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        if ( pDriver == Abc_AigConst1(pNtk) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? " 0\n" : " 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        vSupp = Vec_WecEntry( vSupps, i );
        Vec_IntForEachEntry( vSupp, iCi, k )
            Abc_ObjAddFanin( pNodeNew, Abc_NtkCi(pNtkNew, iCi) );
        pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, (const char*)Vec_PtrEntry( vSops, i ) );
        assert( pNodeNew->pData != (void *)(ABC_PTRINT_T)1 );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }
    Vec_WecFree( vSupps );
    Vec_PtrFree( vSops );
    Abc_NtkSortSops( pNtkNew );
    return pNtkNew;
}